

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

void __thiscall
aeron::archive::AeronArchive::truncateRecording
          (AeronArchive *this,int64_t recordingId,int64_t position)

{
  int64_t position_local;
  int64_t recordingId_local;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  position_local = position;
  recordingId_local = recordingId;
  local_28._M_unused._M_object = operator_new(0x18);
  *(AeronArchive **)local_28._M_unused._0_8_ = this;
  *(int64_t **)((long)local_28._M_unused._0_8_ + 8) = &recordingId_local;
  *(int64_t **)((long)local_28._M_unused._0_8_ + 0x10) = &position_local;
  pcStack_10 = std::
               _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:284:9)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:284:9)>
             ::_M_manager;
  callAndPollForResponse(this,(function<bool_(long)> *)&local_28,"truncate recording");
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void AeronArchive::truncateRecording(std::int64_t recordingId, std::int64_t position) {
    callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->truncateRecording(recordingId, position, correlationId, controlSessionId_);
        },
        "truncate recording");
}